

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  uhugeint_t *puVar2;
  uhugeint_t *puVar3;
  uhugeint_t *puVar4;
  Vector *in_RDX;
  idx_t in_RSI;
  uhugeint_t uVar5;
  uhugeint_t *result_data;
  uhugeint_t *rdata;
  uhugeint_t *ldata;
  ValidityMask *mask;
  undefined1 fun_00;
  uhugeint_t in_stack_ffffffffffffffb8;
  
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  puVar2 = ConstantVector::GetData<duckdb::uhugeint_t>((Vector *)0xe7b254);
  puVar3 = ConstantVector::GetData<duckdb::uhugeint_t>((Vector *)0xe7b263);
  puVar4 = ConstantVector::GetData<duckdb::uhugeint_t>((Vector *)0xe7b272);
  bVar1 = ConstantVector::IsNull((Vector *)0xe7b281);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0xe7b28f), !bVar1)) {
    mask = (ValidityMask *)puVar2->lower;
    fun_00 = (undefined1)(puVar2->upper >> 0x38);
    ConstantVector::Validity(in_RDX);
    uVar5.upper = (uint64_t)puVar3;
    uVar5.lower = (uint64_t)puVar4;
    uVar5 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::BitwiseShiftLeftOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                      ((bool)fun_00,uVar5,in_stack_ffffffffffffffb8,mask,in_RSI);
    puVar4->lower = uVar5.lower;
    puVar4->upper = uVar5.upper;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}